

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O0

void __thiscall ZXing::OneD::Raw2TxtDecoder::Raw2TxtDecoder(Raw2TxtDecoder *this,int startCode)

{
  int in_ESI;
  int *in_RDI;
  
  *in_RDI = 0xcc - in_ESI;
  *(undefined1 *)(in_RDI + 1) = 0x43;
  *(undefined1 *)((long)in_RDI + 5) = 0x30;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 7) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined1 *)(in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0x39) = 0;
  *(undefined1 *)((long)in_RDI + 0x3a) = 0;
  std::__cxx11::string::reserve((ulong)(in_RDI + 4));
  return;
}

Assistant:

Raw2TxtDecoder(int startCode) : codeSet(204 - startCode)
	{
		txt.reserve(20);
	}